

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

Context * Rml::CreateContext(String *name,Vector2i dimensions,
                            RenderInterface *render_interface_for_context,
                            TextInputHandler *text_input_handler_for_context)

{
  RenderInterface *name_00;
  bool bVar1;
  undefined8 uVar2;
  Context *pCVar3;
  CoreData *pCVar4;
  unique_ptr *this;
  pointer render_manager_00;
  pointer this_00;
  Vector2i context;
  type this_01;
  Context *new_context_raw;
  unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_> local_48;
  ContextPtr new_context;
  unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *render_manager;
  TextInputHandler *text_input_handler_for_context_local;
  RenderInterface *render_interface_for_context_local;
  String *name_local;
  Vector2i dimensions_local;
  
  if ((initialised & 1) == 0) {
    dimensions_local.x = 0;
    dimensions_local.y = 0;
  }
  else {
    text_input_handler_for_context_local = (TextInputHandler *)render_interface_for_context;
    if (render_interface_for_context == (RenderInterface *)0x0) {
      text_input_handler_for_context_local = render_interface;
    }
    render_manager =
         (unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
         text_input_handler_for_context;
    if (text_input_handler_for_context == (TextInputHandler *)0x0) {
      render_manager = text_input_handler;
    }
    render_interface_for_context_local = (RenderInterface *)name;
    name_local = (String *)dimensions;
    if (text_input_handler_for_context_local == (TextInputHandler *)0x0) {
      uVar2 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,
                   "Failed to create context \'%s\', no render interface specified and no default render interface exists."
                   ,uVar2);
      dimensions_local.x = 0;
      dimensions_local.y = 0;
    }
    else {
      pCVar3 = GetContext(name);
      if (pCVar3 == (Context *)0x0) {
        pCVar4 = ControlledLifetimeResource<Rml::CoreData>::operator->
                           ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
        this = (unique_ptr *)
               itlib::
               flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
               ::operator[]<Rml::RenderInterface*&>
                         ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                           *)&pCVar4->render_managers,
                          (RenderInterface **)&text_input_handler_for_context_local);
        bVar1 = ::std::unique_ptr::operator_cast_to_bool(this);
        if (!bVar1) {
          MakeUnique<Rml::RenderManager,Rml::RenderInterface*&>((RenderInterface **)&new_context);
          ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::operator=
                    ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                     this,(unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>
                           *)&new_context);
          ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::
          ~unique_ptr((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                      &new_context);
        }
        name_00 = render_interface_for_context_local;
        render_manager_00 =
             ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::get
                       ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                        this);
        Factory::InstanceContext
                  ((Factory *)&local_48,(String *)name_00,render_manager_00,
                   (TextInputHandler *)render_manager);
        bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
        if (bVar1) {
          this_00 = ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::operator->
                              (&local_48);
          Context::SetDimensions(this_00,(Vector2i)name_local);
          context = (Vector2i)
                    ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::get(&local_48);
          pCVar4 = ControlledLifetimeResource<Rml::CoreData>::operator->
                             ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
          this_01 = robin_hood::detail::
                    Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                    ::operator[]<std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>>
                              ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                *)&pCVar4->contexts,(key_type *)render_interface_for_context_local);
          ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::operator=
                    (this_01,&local_48);
          PluginRegistry::NotifyContextCreate((Context *)context);
          dimensions_local = context;
        }
        else {
          uVar2 = ::std::__cxx11::string::c_str();
          Log::Message(LT_WARNING,"Failed to instance context \'%s\', instancer returned nullptr.",
                       uVar2);
          dimensions_local.x = 0;
          dimensions_local.y = 0;
        }
        ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::~unique_ptr(&local_48);
      }
      else {
        uVar2 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Failed to create context \'%s\', context already exists.",uVar2);
        dimensions_local.x = 0;
        dimensions_local.y = 0;
      }
    }
  }
  return (Context *)dimensions_local;
}

Assistant:

Context* CreateContext(const String& name, const Vector2i dimensions, RenderInterface* render_interface_for_context,
	TextInputHandler* text_input_handler_for_context)
{
	if (!initialised)
		return nullptr;

	if (!render_interface_for_context)
		render_interface_for_context = render_interface;

	if (!text_input_handler_for_context)
		text_input_handler_for_context = text_input_handler;

	if (!render_interface_for_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', no render interface specified and no default render interface exists.",
			name.c_str());
		return nullptr;
	}

	if (GetContext(name))
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', context already exists.", name.c_str());
		return nullptr;
	}

	// Each unique render interface gets its own render manager.
	auto& render_manager = core_data->render_managers[render_interface_for_context];
	if (!render_manager)
		render_manager = MakeUnique<RenderManager>(render_interface_for_context);

	ContextPtr new_context = Factory::InstanceContext(name, render_manager.get(), text_input_handler_for_context);
	if (!new_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to instance context '%s', instancer returned nullptr.", name.c_str());
		return nullptr;
	}

	new_context->SetDimensions(dimensions);

	Context* new_context_raw = new_context.get();
	core_data->contexts[name] = std::move(new_context);

	PluginRegistry::NotifyContextCreate(new_context_raw);

	return new_context_raw;
}